

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O1

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLast
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this)

{
  bool bVar1;
  Node *in_RAX;
  Node *pNVar2;
  Node *pNVar3;
  uint uVar4;
  
  uVar4 = (this->max_height_).super___atomic_base<int>._M_i - 1;
  pNVar2 = this->head_;
  do {
    if ((int)uVar4 < 0) {
      __assert_fail("n >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/skiplist.h"
                    ,0x9a,
                    "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
                   );
    }
    pNVar3 = pNVar2->next_[uVar4]._M_b._M_p;
    bVar1 = true;
    if (pNVar3 == (Node *)0x0) {
      pNVar3 = pNVar2;
      if (uVar4 == 0) {
        uVar4 = 0;
        bVar1 = false;
        in_RAX = pNVar2;
      }
      else {
        uVar4 = uVar4 - 1;
      }
    }
    pNVar2 = pNVar3;
  } while (bVar1);
  return in_RAX;
}

Assistant:

typename SkipList<Key, Comparator>::Node* SkipList<Key, Comparator>::FindLast()
    const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (next == nullptr) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}